

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

bool exists(v_array<unsigned_long> db)

{
  size_t sVar1;
  unsigned_long *puVar2;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = v_array<unsigned_long>::size((v_array<unsigned_long> *)&stack0x00000008);
    if (sVar1 <= local_10) {
      return false;
    }
    puVar2 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)&stack0x00000008,local_10)
    ;
    if (*puVar2 != 0) break;
    local_10 = local_10 + 1;
  }
  return true;
}

Assistant:

bool exists(v_array<size_t> db)
{
  for (size_t i = 0; i < db.size(); i++)
    if (db[i] != 0)
      return true;
  return false;
}